

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::CloseCurrentPopup(void)

{
  int iVar1;
  ImGuiPopupData *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ulong uVar6;
  
  pIVar4 = GImGui;
  iVar5 = (GImGui->BeginPopupStack).Size;
  if ((0 < (long)iVar5) && (iVar1 = (GImGui->OpenPopupStack).Size, iVar5 <= iVar1)) {
    uVar6 = (long)iVar5 - 1;
    pIVar2 = (GImGui->OpenPopupStack).Data;
    if ((GImGui->BeginPopupStack).Data[uVar6].PopupId == pIVar2[uVar6].PopupId) {
      do {
        iVar5 = (int)uVar6;
        if (iVar5 < 1) {
          iVar5 = 0;
          break;
        }
        if (iVar1 <= iVar5) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                        ,0x4e6,"T &ImVector<ImGuiPopupData>::operator[](int) [T = ImGuiPopupData]");
        }
        if ((pIVar2[uVar6 & 0xffffffff].Window == (ImGuiWindow *)0x0) ||
           (((pIVar2[uVar6 & 0xffffffff].Window)->Flags & 0x10000000) == 0)) {
LAB_0011d750:
          bVar3 = false;
          uVar6 = uVar6 & 0xffffffff;
        }
        else {
          if ((pIVar2[(int)(iVar5 - 1U)].Window != (ImGuiWindow *)0x0) &&
             (((pIVar2[(int)(iVar5 - 1U)].Window)->Flags & 0x8000000) != 0)) goto LAB_0011d750;
          bVar3 = true;
          uVar6 = (ulong)(iVar5 - 1U);
        }
        iVar5 = (int)uVar6;
      } while (bVar3);
      ClosePopupToLevel(iVar5,true);
      if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar4->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window == NULL || !(parent_popup_window->Flags & ImGuiWindowFlags_Modal))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    //IMGUI_DEBUG_LOG("CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}